

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O2

void Js::JavascriptOperators::IteratorClose(RecyclableObject *iterator,ScriptContext *scriptContext)

{
  ThreadContext *this;
  bool bVar1;
  bool bVar2;
  Attributes attributes;
  Var pvVar3;
  RecyclableObject *function;
  ImplicitCallFlags IVar4;
  anon_class_16_2_1e90eea3 local_40;
  
  pvVar3 = GetProperty(iterator,0x135,scriptContext,(PropertyValueInfo *)0x0);
  bVar1 = JavascriptConversion::IsCallable(pvVar3);
  if (!bVar1) {
    return;
  }
  function = VarTo<Js::RecyclableObject>(pvVar3);
  this = scriptContext->threadContext;
  bVar1 = this->reentrancySafeOrHandled;
  this->reentrancySafeOrHandled = true;
  local_40.iterator = iterator;
  local_40.callable = function;
  attributes = FunctionInfo::GetAttributes(function);
  bVar2 = ThreadContext::HasNoSideEffect(this,function,attributes);
  if (bVar2) {
    pvVar3 = IteratorClose::anon_class_16_2_1e90eea3::operator()(&local_40);
    bVar2 = ThreadContext::IsOnStack(pvVar3);
LAB_009ab422:
    if (bVar2 == false) goto LAB_009ab465;
LAB_009ab450:
    IVar4 = this->implicitCallFlags;
  }
  else {
    if ((this->disableImplicitFlags & DisableImplicitCallFlag) != DisableImplicitNoFlag)
    goto LAB_009ab450;
    if ((attributes & HasNoSideEffect) != None) {
      pvVar3 = IteratorClose::anon_class_16_2_1e90eea3::operator()(&local_40);
      bVar2 = ThreadContext::IsOnStack(pvVar3);
      goto LAB_009ab422;
    }
    IVar4 = this->implicitCallFlags;
    IteratorClose::anon_class_16_2_1e90eea3::operator()(&local_40);
  }
  this->implicitCallFlags = IVar4 | ImplicitCall_Accessor;
LAB_009ab465:
  this->reentrancySafeOrHandled = bVar1;
  return;
}

Assistant:

void JavascriptOperators::IteratorClose(RecyclableObject* iterator, ScriptContext* scriptContext)
    {
        try
        {
            Var func = JavascriptOperators::GetProperty(iterator, PropertyIds::return_, scriptContext);

            if (JavascriptConversion::IsCallable(func))
            {
                RecyclableObject* callable = VarTo<RecyclableObject>(func);
                scriptContext->GetThreadContext()->ExecuteImplicitCall(callable, ImplicitCall_Accessor, [=]()->Var
                {
                    Js::Var args[] = { iterator };
                    Js::CallInfo callInfo(Js::CallFlags_Value, _countof(args));
                    return JavascriptFunction::CallFunction<true>(callable, callable->GetEntryPoint(), Js::Arguments(callInfo, args));
                });
            }
        }
        catch (const JavascriptException& err)
        {
            err.GetAndClear();  // discard exception object
            // We have arrived in this function due to AbruptCompletion (which is an exception), so we don't need to
            // propagate the exception of calling return function
        }
    }